

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O0

aom_codec_err_t __thiscall
anon_unknown.dwarf_79f906::ExternalFrameBufferTest::SetFrameBufferFunctions
          (ExternalFrameBufferTest *this,int num_buffers,aom_get_frame_buffer_cb_fn_t cb_get,
          aom_release_frame_buffer_cb_fn_t cb_release)

{
  bool bVar1;
  aom_codec_err_t aVar2;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  AssertionResult *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar_;
  bool *in_stack_ffffffffffffff78;
  aom_get_frame_buffer_cb_fn_t in_stack_ffffffffffffff88;
  Decoder *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type in_stack_ffffffffffffffac;
  AssertHelper *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffd4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  AssertionResult *assertion_result;
  
  if (0 < in_ESI) {
    *(int *)(in_RDI + 2) = in_ESI;
    assertion_result = in_RDI;
    ExternalFrameBufferList::CreateBufferList
              ((ExternalFrameBufferList *)
               in_stack_ffffffffffffffd8._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,in_stack_ffffffffffffffd4);
    testing::AssertionResult::AssertionResult<bool>
              (in_RDI,in_stack_ffffffffffffff78,(type *)0x713aa9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffd0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,(char *)in_stack_ffffffffffffff90);
      testing::internal::AssertHelper::operator=(unaff_retaddr,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_RDI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      testing::Message::~Message((Message *)0x713b49);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x713bb3);
  }
  aVar2 = libaom_test::Decoder::SetFrameBufferFunctions
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (aom_release_frame_buffer_cb_fn_t)in_RDI,in_stack_ffffffffffffff78);
  return aVar2;
}

Assistant:

aom_codec_err_t SetFrameBufferFunctions(
      int num_buffers, aom_get_frame_buffer_cb_fn_t cb_get,
      aom_release_frame_buffer_cb_fn_t cb_release) {
    if (num_buffers > 0) {
      num_buffers_ = num_buffers;
      EXPECT_TRUE(fb_list_.CreateBufferList(num_buffers_));
    }

    return decoder_->SetFrameBufferFunctions(cb_get, cb_release, &fb_list_);
  }